

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

iterator __thiscall QList<QTextLayout::FormatRange>::end(QList<QTextLayout::FormatRange> *this)

{
  detach(this);
  return (iterator)((this->d).ptr + (this->d).size);
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }